

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

void __thiscall Shell::EqualityProxyMono::addAxioms(EqualityProxyMono *this,UnitList **units)

{
  TermList *pTVar1;
  bool bVar2;
  Iterator local_38;
  
  if (this->_opt == RSTC) {
    addCongruenceAxioms(this,units);
  }
  local_38._base._next = s_proxyPredicates._entries;
  local_38._base._last = s_proxyPredicates._afterLast;
  local_38._base._timestamp = s_proxyPredicates._timestamp;
  bVar2 = ::Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
          Iterator::hasNext(&local_38);
  if (bVar2) {
    do {
      pTVar1 = &(local_38._base._next)->_key;
      local_38._base._next = local_38._base._next + 1;
      addLocalAxioms(this,units,(TermList)pTVar1->_content);
      bVar2 = ::Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
              Iterator::hasNext(&local_38);
    } while (bVar2);
  }
  return;
}

Assistant:

void EqualityProxyMono::addAxioms(UnitList*& units)
{
  // if we're adding congruence axioms, we need to add them before adding the local axioms.
  // Local axioms are added only for sorts on which equality is used, and the congruence axioms
  // may spread the equality use into new sorts
  if (_opt == Options::EqualityProxy::RSTC) {
    addCongruenceAxioms(units);
  }

  DHMap<TermList, unsigned>::Iterator it(s_proxyPredicates);
  while(it.hasNext()) {
    addLocalAxioms(units, it.nextKey());
  }
}